

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

wchar_t assertion_equal_file(char *filename,wchar_t line,char *fn1,char *fn2)

{
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  size_t sVar2;
  size_t sVar3;
  char buff2 [1024];
  char buff1 [1024];
  undefined1 local_838 [1024];
  undefined1 local_438 [1032];
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  __stream = fopen(fn1,"rb");
  __stream_00 = fopen(fn2,"rb");
  if (__stream_00 == (FILE *)0x0 || __stream == (FILE *)0x0) {
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    if (__stream_00 != (FILE *)0x0) {
      fclose(__stream_00);
    }
  }
  else {
    do {
      sVar2 = fread(local_438,1,0x400,__stream);
      sVar3 = fread(local_838,1,0x400,__stream_00);
      if ((int)sVar2 != (int)sVar3) break;
      if ((int)sVar3 == 0) {
        fclose(__stream);
        fclose(__stream_00);
        return L'\x01';
      }
      iVar1 = bcmp(local_438,local_838,(long)(int)sVar2);
    } while (iVar1 == 0);
    fclose(__stream);
    fclose(__stream_00);
    failure_start(filename,line,"Files not identical");
    logprintf("  file1=\"%s\"\n",fn1);
    logprintf("  file2=\"%s\"\n",fn2);
    failure_finish((void *)0x0);
  }
  return L'\0';
}

Assistant:

int
assertion_equal_file(const char *filename, int line, const char *fn1, const char *fn2)
{
	char buff1[1024];
	char buff2[1024];
	FILE *f1, *f2;
	int n1, n2;

	assertion_count(filename, line);

	f1 = fopen(fn1, "rb");
	f2 = fopen(fn2, "rb");
	if (f1 == NULL || f2 == NULL) {
		if (f1) fclose(f1);
		if (f2) fclose(f2);
		return (0);
	}
	for (;;) {
		n1 = (int)fread(buff1, 1, sizeof(buff1), f1);
		n2 = (int)fread(buff2, 1, sizeof(buff2), f2);
		if (n1 != n2)
			break;
		if (n1 == 0 && n2 == 0) {
			fclose(f1);
			fclose(f2);
			return (1);
		}
		if (memcmp(buff1, buff2, n1) != 0)
			break;
	}
	fclose(f1);
	fclose(f2);
	failure_start(filename, line, "Files not identical");
	logprintf("  file1=\"%s\"\n", fn1);
	logprintf("  file2=\"%s\"\n", fn2);
	failure_finish(NULL);
	return (0);
}